

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

void __thiscall
jwt::algorithm::rs256::rs256
          (rs256 *this,string *public_key,string *private_key,string *public_key_password,
          string *private_key_password)

{
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"RS256",&local_51);
  rsa::rsa(&this->super_rsa,public_key,private_key,public_key_password,private_key_password,
           EVP_sha256,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

explicit rs256(const std::string& public_key, const std::string& private_key = "", const std::string& public_key_password = "", const std::string& private_key_password = "")
				: rsa(public_key, private_key, public_key_password, private_key_password, EVP_sha256, "RS256")
			{}